

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O0

void __thiscall Corrade::Utility::Arguments::parse(Arguments *this,int argc,char **argv)

{
  bool bVar1;
  Entry *pEVar2;
  bool *pbVar3;
  string local_e8;
  Flags local_c1;
  Debug local_c0;
  string local_a0;
  Flags local_79;
  Debug local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  byte local_21;
  char **ppcStack_20;
  bool status;
  char **argv_local;
  Arguments *pAStack_10;
  int argc_local;
  Arguments *this_local;
  
  ppcStack_20 = argv;
  argv_local._4_4_ = argc;
  pAStack_10 = this;
  local_21 = tryParse(this,argc,argv);
  std::operator+(&local_48,&this->_prefix,"help");
  pEVar2 = find(this,&local_48);
  pbVar3 = Containers::Array<bool,_void_(*)(bool_*,_unsigned_long)>::operator[]<unsigned_long,_0>
                     (&this->_booleans,pEVar2->id);
  bVar1 = *pbVar3;
  std::__cxx11::string::~string((string *)&local_48);
  if ((bVar1 & 1U) != 0) {
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
              (&local_79,NoNewlineAtTheEnd);
    Debug::Debug(&local_78,local_79);
    help_abi_cxx11_(&local_a0,this);
    Utility::operator<<(&local_78,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    Debug::~Debug(&local_78);
    exit(0);
  }
  if ((local_21 & 1) == 0) {
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
              (&local_c1,NoNewlineAtTheEnd);
    Debug::Debug(&local_c0,local_c1);
    usage_abi_cxx11_(&local_e8,this);
    Utility::operator<<(&local_c0,&local_e8);
    std::__cxx11::string::~string((string *)&local_e8);
    Debug::~Debug(&local_c0);
    exit(1);
  }
  return;
}

Assistant:

void Arguments::parse(const int argc, const char* const* const argv) {
    const bool status = tryParse(argc, argv);

    if(_booleans[find(_prefix + "help")->id]) {
        /* LCOV_EXCL_START */
        Debug{Debug::Flag::NoNewlineAtTheEnd} << help();
        std::exit(0);
        /* LCOV_EXCL_STOP */
    }

    if(!status) {
        /* LCOV_EXCL_START */
        Debug{Debug::Flag::NoNewlineAtTheEnd} << usage();
        std::exit(1);
        /* LCOV_EXCL_STOP */
    }
}